

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue * build_arg_list(JSContext *ctx,uint32_t *plen,JSValue array_arg)

{
  int *piVar1;
  undefined8 uVar2;
  int iVar3;
  JSValue *tab;
  long lVar4;
  JSValueUnion JVar5;
  int64_t *piVar6;
  uint32_t len_00;
  void *pvVar7;
  JSValueUnion JVar8;
  int64_t iVar9;
  JSValue JVar10;
  uint32_t len;
  uint local_3c;
  uint32_t *local_38;
  
  JVar8 = array_arg.u;
  if ((int)array_arg.tag != -1) {
    JS_ThrowTypeError(ctx,"not a object");
    return (JSValue *)0x0;
  }
  iVar3 = js_get_length32(ctx,&local_3c,array_arg);
  if (iVar3 == 0) {
    pvVar7 = (void *)(ulong)local_3c;
    if ((void *)0x10000 < pvVar7) {
      JS_ThrowInternalError(ctx,"too many arguments");
      return (JSValue *)0x0;
    }
    tab = (JSValue *)js_mallocz(ctx,(ulong)((local_3c + (local_3c == 0)) * 0x10));
    if (tab != (JSValue *)0x0) {
      local_38 = plen;
      if ((((*(short *)((long)JVar8.ptr + 6) == 8) || (*(short *)((long)JVar8.ptr + 6) == 2)) &&
          ((*(byte *)((long)JVar8.ptr + 5) & 8) != 0)) &&
         (local_3c == *(uint *)((long)JVar8.ptr + 0x40))) {
        if (local_3c != 0) {
          lVar4 = 0;
          do {
            piVar1 = *(int **)(*(long *)((long)JVar8.ptr + 0x38) + lVar4);
            uVar2 = *(undefined8 *)(*(long *)((long)JVar8.ptr + 0x38) + 8 + lVar4);
            if (0xfffffff4 < (uint)uVar2) {
              *piVar1 = *piVar1 + 1;
            }
            *(int **)((long)&tab->u + lVar4) = piVar1;
            *(undefined8 *)((long)&tab->tag + lVar4) = uVar2;
            lVar4 = lVar4 + 0x10;
          } while ((long)pvVar7 << 4 != lVar4);
        }
      }
      else if (local_3c != 0) {
        piVar6 = &tab->tag;
        JVar8.float64 = 0.0;
        do {
          len_00 = JVar8.int32;
          JVar5.float64 = (double)((ulong)JVar8.ptr & 0xffffffff);
          if (-1 < (int)len_00) {
            JVar5 = JVar8;
          }
          iVar9 = 7;
          if (-1 < (int)len_00) {
            iVar9 = 0;
          }
          JVar10.tag = iVar9;
          JVar10.u.float64 = JVar5.float64;
          JVar10 = JS_GetPropertyValue(ctx,array_arg,JVar10);
          if ((int)JVar10.tag == 6) {
            free_arg_list(ctx,tab,len_00);
            return (JSValue *)0x0;
          }
          *(JSValueUnion *)(piVar6 + -1) = JVar10.u;
          *piVar6 = JVar10.tag;
          JVar8.float64 = JVar8.float64 + 1;
          piVar6 = piVar6 + 2;
        } while (pvVar7 != JVar8.ptr);
      }
      *local_38 = local_3c;
      return tab;
    }
  }
  return (JSValue *)0x0;
}

Assistant:

static JSValue *build_arg_list(JSContext *ctx, uint32_t *plen,
                               JSValueConst array_arg)
{
    uint32_t len, i;
    JSValue *tab, ret;
    JSObject *p;

    if (JS_VALUE_GET_TAG(array_arg) != JS_TAG_OBJECT) {
        JS_ThrowTypeError(ctx, "not a object");
        return NULL;
    }
    if (js_get_length32(ctx, &len, array_arg))
        return NULL;
    if (len > JS_MAX_LOCAL_VARS) {
        JS_ThrowInternalError(ctx, "too many arguments");
        return NULL;
    }
    /* avoid allocating 0 bytes */
    tab = js_mallocz(ctx, sizeof(tab[0]) * max_uint32(1, len));
    if (!tab)
        return NULL;
    p = JS_VALUE_GET_OBJ(array_arg);
    if ((p->class_id == JS_CLASS_ARRAY || p->class_id == JS_CLASS_ARGUMENTS) &&
        p->fast_array &&
        len == p->u.array.count) {
        for(i = 0; i < len; i++) {
            tab[i] = JS_DupValue(ctx, p->u.array.u.values[i]);
        }
    } else {
        for(i = 0; i < len; i++) {
            ret = JS_GetPropertyUint32(ctx, array_arg, i);
            if (JS_IsException(ret)) {
                free_arg_list(ctx, tab, i);
                return NULL;
            }
            tab[i] = ret;
        }
    }
    *plen = len;
    return tab;
}